

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIExternalCommand::executeExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *job_context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  bool bVar1;
  llb_buildsystem_command_result_t result_00;
  ProcessStatus result_01;
  undefined8 *puVar2;
  pointer del;
  llb_build_value *plVar3;
  BuildValue *this_00;
  anon_class_8_1_8991fb9c_for_deferredWork aVar4;
  llb_buildsystem_command_result_t result;
  ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
  local_d8;
  ScopeDefer<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_apple[P]swift_llbuild_products_libllbuild_BuildSystem_C_API_cpp:1117:7)>
  _defer_2;
  llb_build_value *rvalue;
  unique_ptr<CAPICancellationDelegate,_std::default_delete<CAPICancellationDelegate>_> local_a8;
  CAPIExternalCommand *local_a0;
  void *local_98;
  undefined8 *local_90;
  ResultCallbackContext *callbackCtx;
  anon_class_80_5_b6e7d4dc doneFn;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *job_context_local;
  BuildSystem *system_local;
  CAPIExternalCommand *this_local;
  TaskInterface ti_local;
  
  aVar4.this = (CAPIExternalCommand *)ti.impl;
  callbackCtx = (ResultCallbackContext *)this;
  doneFn.this = (CAPIExternalCommand *)system;
  doneFn.system = (BuildSystem *)aVar4.this;
  doneFn.ti.impl = ti.ctx;
  doneFn.ti.ctx = job_context;
  doneFn.completionFn.Storage._32_8_ = completionFn;
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            ((Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)&doneFn.job_context,
             completionFn);
  if ((this->cAPIDelegate).execute_command_detached ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr_void_ptr__func_void_void_ptr_llb_buildsystem_command_result_t_llb_build_value_ptr_ptr
       *)0x0) {
    if ((this->cAPIDelegate).execute_command_ex !=
        (_func_llb_build_value_ptr_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
         *)0x0) {
      _defer_2.deferredWork.this =
           (anon_class_8_1_8991fb9c_for_deferredWork)
           (anon_class_8_1_8991fb9c_for_deferredWork)aVar4.this;
      plVar3 = (*(this->cAPIDelegate).execute_command_ex)
                         ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                          (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                          (llb_buildsystem_queue_job_context_t *)job_context);
      this->currentBuildValue = (CAPIBuildValue *)plVar3;
      llbuild::basic::impl::operator+(&local_d8);
      this_00 = CAPIBuildValue::getInternalBuildValue(this->currentBuildValue);
      bVar1 = llbuild::buildsystem::BuildValue::isInvalid(this_00);
      if (!bVar1) {
        executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
                  ((anon_class_80_5_b6e7d4dc *)&callbackCtx,Succeeded);
      }
      llbuild::basic::
      ScopeDefer<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp:1117:7)>
      ::~ScopeDefer(&local_d8);
      if (!bVar1) goto LAB_0023da3e;
    }
    if ((this->cAPIDelegate).execute_command ==
        (_func_llb_buildsystem_command_result_t_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_interface_t_ptr_llb_task_interface_t_llb_buildsystem_queue_job_context_t_ptr
         *)0x0) {
      __assert_fail("cAPIDelegate.execute_command != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x46b,
                    "virtual void (anonymous namespace)::CAPIExternalCommand::executeExternalCommand(BuildSystem &, core::TaskInterface, QueueJobContext *, llvm::Optional<ProcessCompletionFn>)"
                   );
    }
    result_00 = (*(this->cAPIDelegate).execute_command)
                          ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
                           (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
                           (llb_buildsystem_queue_job_context_t *)job_context);
    result_01 = getProcessStatusFromLLBResult(result_00);
    executeExternalCommand::anon_class_80_5_b6e7d4dc::operator()
              ((anon_class_80_5_b6e7d4dc *)&callbackCtx,result_01);
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x30);
    *puVar2 = this;
    puVar2[1] = system;
    std::function<void(llbuild::basic::ProcessStatus)>::
    function<(anonymous_namespace)::CAPIExternalCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::ProcessStatus)_1_,void>
              ((function<void(llbuild::basic::ProcessStatus)> *)(puVar2 + 2),
               (anon_class_80_5_b6e7d4dc *)&callbackCtx);
    local_a0 = aVar4.this;
    local_98 = ti.ctx;
    local_90 = puVar2;
    (*(this->cAPIDelegate).execute_command_detached)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
               (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
               (llb_buildsystem_queue_job_context_t *)job_context,puVar2,
               executeExternalCommand::ResultCallbackContext::callback);
    if ((this->cAPIDelegate).cancel_detached_command !=
        (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
      std::
      make_unique<(anonymous_namespace)::CAPIExternalCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::CAPICancellationDelegate,(anonymous_namespace)::CAPIExternalCommand*>
                ((CAPIExternalCommand **)&local_a8);
      std::
      unique_ptr<llbuild::core::CancellationDelegate,std::default_delete<llbuild::core::CancellationDelegate>>
      ::operator=((unique_ptr<llbuild::core::CancellationDelegate,std::default_delete<llbuild::core::CancellationDelegate>>
                   *)&this->cancellationDelegate,&local_a8);
      std::unique_ptr<CAPICancellationDelegate,_std::default_delete<CAPICancellationDelegate>_>::
      ~unique_ptr(&local_a8);
      del = std::
            unique_ptr<llbuild::core::CancellationDelegate,_std::default_delete<llbuild::core::CancellationDelegate>_>
            ::get(&this->cancellationDelegate);
      llbuild::buildsystem::BuildSystem::addCancellationDelegate(system,del);
    }
  }
LAB_0023da3e:
  (anonymous_namespace)::CAPIExternalCommand::
  executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
  ::{lambda(llbuild::basic::ProcessStatus)#1}::~ProcessStatus
            ((_lambda_llbuild__basic__ProcessStatus__1_ *)&callbackCtx);
  return;
}

Assistant:

virtual void executeExternalCommand(BuildSystem& system,
                                      core::TaskInterface ti,
                                      QueueJobContext* job_context,
                                      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto doneFn = [this, &system, ti, job_context, completionFn](ProcessStatus result) mutable {
      if (result != ProcessStatus::Succeeded) {
        // If the command did not succeed, there is no need to gather dependencies.
        if (completionFn.hasValue())
          completionFn.getValue()(result);
        return;
      }

      // Otherwise, collect the discovered dependencies, if used.
      bool dependencyParsingResult = false;
      if (!depsPaths.empty()) {
        for (const auto& depsPath: depsPaths) {
          switch (depsFormat) {
            case llb_buildsystem_dependency_data_format_unused:
              ti.delegate()->error("No dependency format specified for discovered dependency files.");
              dependencyParsingResult = false;
              break;
            case llb_buildsystem_dependency_data_format_makefile:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, false);
              break;
            case llb_buildsystem_dependency_data_format_dependencyinfo:
              dependencyParsingResult = processDependencyInfoDiscoveredDependencies(system, ti, job_context, depsPath);
              break;
            case llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs:
              dependencyParsingResult = processMakefileDiscoveredDependencies(system, ti, job_context, depsPath, true);
              break;
          }
          
          if (!dependencyParsingResult) {
            // If we were unable to process the dependencies output, report a
            // failure.
            if (completionFn.hasValue())
              completionFn.getValue()(ProcessStatus::Failed);
            return;
          }
        }
      }

      if (completionFn.hasValue())
        completionFn.getValue()(result);
    };

    if (cAPIDelegate.execute_command_detached) {
      struct ResultCallbackContext {
        CAPIExternalCommand *thisCommand;
        BuildSystem *buildSystem;
        std::function<void(ProcessStatus result)> doneFn;

        static void callback(void* result_ctx,
                             llb_buildsystem_command_result_t result,
                             llb_build_value* rvalue) {
          ResultCallbackContext *ctx = static_cast<ResultCallbackContext*>(result_ctx);
          auto thisCommand = ctx->thisCommand;
          BuildSystem &system = *ctx->buildSystem;
          auto doneFn = std::move(ctx->doneFn);
          delete ctx;

          thisCommand->detachedCommandFinished = true;
          if (auto cancellationDelegate = thisCommand->cancellationDelegate.get()) {
            system.removeCancellationDelegate(cancellationDelegate);
            thisCommand->cancellationDelegate = nullptr;
          }

          thisCommand->currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
          llbuild_defer {
            delete thisCommand->currentBuildValue;
            thisCommand->currentBuildValue = nullptr;
          };
          doneFn(getProcessStatusFromLLBResult(result));
        }
      };
      auto *callbackCtx = new ResultCallbackContext{this, &system, std::move(doneFn)};
      cAPIDelegate.execute_command_detached(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context,
        callbackCtx, ResultCallbackContext::callback);

      if (cAPIDelegate.cancel_detached_command) {
        class CAPICancellationDelegate: public core::CancellationDelegate {
          CAPIExternalCommand *thisCommand;

        public:
          CAPICancellationDelegate(CAPIExternalCommand *thisCommand) : thisCommand(thisCommand) {}

          void buildCancelled() override {
            if (thisCommand->detachedCommandFinished)
              return;
            thisCommand->cAPIDelegate.cancel_detached_command(
              thisCommand->cAPIDelegate.context,
              (llb_buildsystem_command_t*)this);
          }
        };
        this->cancellationDelegate = std::make_unique<CAPICancellationDelegate>(this);
        system.addCancellationDelegate(this->cancellationDelegate.get());
      }
      return;
    }

    if (cAPIDelegate.execute_command_ex) {
      llb_build_value* rvalue = cAPIDelegate.execute_command_ex(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*)this,
        (llb_buildsystem_interface_t*)&system,
        *reinterpret_cast<llb_task_interface_t*>(&ti),
        (llb_buildsystem_queue_job_context_t*)job_context);

      currentBuildValue = reinterpret_cast<CAPIBuildValue*>(rvalue);
      llbuild_defer {
        delete currentBuildValue;
        currentBuildValue = nullptr;
      };

      if (!currentBuildValue->getInternalBuildValue().isInvalid()) {
        doneFn(ProcessStatus::Succeeded);
        return;
      }

      // An invalid value is interpreted as an unsupported method call and falls
      // through to execute_command below.
    }